

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

int yaml_parser_update_buffer(yaml_parser_t *parser,size_t length)

{
  yaml_encoding_t yVar1;
  yaml_char_t *pyVar2;
  yaml_char_t *__src;
  yaml_char_t *pyVar3;
  short *__s1;
  byte *pbVar4;
  byte *pbVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  size_t sVar15;
  uint uVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  
  if (parser->read_handler == (yaml_read_handler_t *)0x0) {
    __assert_fail("parser->read_handler",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/reader.c"
                  ,0x92,"int yaml_parser_update_buffer(yaml_parser_t *, size_t)");
  }
  iVar7 = 1;
  if (((parser->eof == 0) || ((parser->raw_buffer).pointer != (parser->raw_buffer).last)) &&
     (parser->unread < length)) {
    if (parser->encoding == YAML_ANY_ENCODING) {
      do {
        __s1 = (short *)(parser->raw_buffer).pointer;
        lVar11 = (long)(parser->raw_buffer).last - (long)__s1;
        if (parser->eof != 0) {
          if (1 < lVar11) goto LAB_0019c7a4;
LAB_0019c7db:
          parser->encoding = YAML_UTF8_ENCODING;
          goto LAB_0019c71a;
        }
        if (2 < lVar11) {
LAB_0019c7a4:
          if (*__s1 == -0x101) {
            parser->encoding = YAML_UTF16LE_ENCODING;
          }
          else {
            if (*__s1 != -2) {
              if ((lVar11 == 2) || (iVar7 = bcmp(__s1,anon_var_dwarf_1d0665,3), iVar7 != 0))
              goto LAB_0019c7db;
              parser->encoding = YAML_UTF8_ENCODING;
              (parser->raw_buffer).pointer = (uchar *)((long)__s1 + 3);
              parser->offset = parser->offset + 3;
              goto LAB_0019c71a;
            }
            parser->encoding = YAML_UTF16BE_ENCODING;
          }
          (parser->raw_buffer).pointer = (uchar *)(__s1 + 1);
          parser->offset = parser->offset + 2;
          goto LAB_0019c71a;
        }
        iVar7 = yaml_parser_update_raw_buffer(parser);
      } while (iVar7 != 0);
LAB_0019cbca:
      iVar7 = 0;
    }
    else {
LAB_0019c71a:
      pyVar2 = (parser->buffer).start;
      __src = (parser->buffer).pointer;
      pyVar3 = (parser->buffer).last;
      if (__src < pyVar3 && pyVar2 < __src) {
        memmove(pyVar2,__src,(long)pyVar3 - (long)__src);
        pyVar2 = (parser->buffer).start;
        (parser->buffer).pointer = pyVar2;
        (parser->buffer).last = pyVar2 + ((long)pyVar3 - (long)__src);
      }
      else if (__src == pyVar3) {
        (parser->buffer).pointer = pyVar2;
        (parser->buffer).last = pyVar2;
      }
      uVar13 = 1;
      bVar6 = false;
LAB_0019c814:
      do {
        if (length <= parser->unread) {
          uVar13 = parser->offset;
          if (uVar13 < 0x7fffffffffffffff) goto LAB_0019ccfa;
          parser->error = YAML_READER_ERROR;
          pcVar17 = "input is too long";
LAB_0019cc87:
          parser->problem = pcVar17;
          parser->problem_offset = uVar13;
          parser->problem_value = -1;
          goto LAB_0019cbca;
        }
        if (((bVar6) || ((parser->raw_buffer).pointer == (parser->raw_buffer).last)) &&
           (iVar7 = yaml_parser_update_raw_buffer(parser), iVar7 == 0)) goto LAB_0019cbca;
        while( true ) {
          pbVar4 = (parser->raw_buffer).pointer;
          pbVar5 = (parser->raw_buffer).last;
          if (pbVar4 == pbVar5) break;
          uVar18 = (long)pbVar5 - (long)pbVar4;
          yVar1 = parser->encoding;
          if (1 < yVar1 - YAML_UTF16LE_ENCODING) {
            uVar16 = 0;
            uVar12 = 0;
            if (yVar1 != YAML_UTF8_ENCODING) goto LAB_0019ca28;
            bVar14 = *pbVar4;
            uVar12 = (ulong)bVar14;
            uVar8 = (uint)bVar14;
            uVar19 = uVar13;
            uVar16 = 1;
            uVar20 = uVar13;
            if ((char)bVar14 < '\0') {
              uVar9 = (uint)bVar14;
              if ((uVar9 & 0xffffffe0) == 0xc0) {
                uVar20 = 2;
                uVar16 = 2;
                if (uVar18 < 2) {
LAB_0019cb82:
                  bVar6 = true;
                  if (parser->eof == 0) goto LAB_0019c814;
                  uVar13 = parser->offset;
                  parser->error = YAML_READER_ERROR;
                  pcVar17 = "incomplete UTF-8 octet sequence";
                  goto LAB_0019cc87;
                }
LAB_0019c99d:
                uVar12 = (ulong)(uVar9 & 0x1f);
              }
              else {
                uVar16 = 3;
                uVar10 = (uint)bVar14;
                if (((uVar9 & 0xfffffff0) != 0xe0) && (uVar16 = 4, (uVar10 & 0xfffffff8) != 0xf0)) {
                  sVar15 = parser->offset;
                  parser->error = YAML_READER_ERROR;
                  pcVar17 = "invalid leading UTF-8 octet";
                  goto LAB_0019ccac;
                }
                uVar20 = (ulong)uVar16;
                if (uVar18 < uVar20) goto LAB_0019cb82;
                if ((uVar9 & 0xffffffe0) == 0xc0) goto LAB_0019c99d;
                if ((uVar9 & 0xfffffff0) == 0xe0) {
                  uVar12 = (ulong)(uVar10 & 0xf);
                }
                else {
                  uVar12 = (ulong)(uVar10 & 7);
                  if ((uVar10 & 0xfffffff8) != 0xf0) {
                    uVar12 = 0;
                  }
                }
              }
            }
            for (; uVar8 = (uint)uVar12, uVar20 != uVar19; uVar19 = uVar19 + 1) {
              bVar14 = pbVar4[uVar19];
              if ((bVar14 & 0xffffffc0) != 0x80) {
                parser->error = YAML_READER_ERROR;
                parser->problem = "invalid trailing UTF-8 octet";
                parser->problem_offset = uVar19 + parser->offset;
                parser->problem_value = (uint)bVar14;
                goto LAB_0019cbca;
              }
              uVar12 = (ulong)(uVar8 << 6 | bVar14 & 0x3f);
            }
            if ((((uVar16 != 1) && ((uVar16 != 2 || (uVar8 < 0x80)))) &&
                ((uVar16 != 3 || (uVar8 < 0x800)))) && ((uVar16 != 4 || (uVar8 < 0x10000)))) {
              uVar13 = parser->offset;
              parser->error = YAML_READER_ERROR;
              pcVar17 = "invalid length of a UTF-8 sequence";
              goto LAB_0019cc87;
            }
            if ((uVar8 < 0x110000) && ((uVar8 & 0xfffff800) != 0xd800)) goto LAB_0019ca1e;
            sVar15 = parser->offset;
            parser->error = YAML_READER_ERROR;
            pcVar17 = "invalid Unicode character";
LAB_0019ccac:
            parser->problem = pcVar17;
            parser->problem_offset = sVar15;
            parser->problem_value = uVar8;
            goto LAB_0019cbca;
          }
          if (uVar18 < 2) {
            bVar6 = true;
            if (parser->eof == 0) goto LAB_0019c814;
            uVar13 = parser->offset;
            parser->error = YAML_READER_ERROR;
            pcVar17 = "incomplete UTF-16 character";
            goto LAB_0019cc87;
          }
          uVar8 = (uint)CONCAT11(pbVar4[yVar1 == YAML_UTF16LE_ENCODING],
                                 pbVar4[yVar1 != YAML_UTF16LE_ENCODING]);
          uVar12 = (ulong)uVar8;
          bVar14 = pbVar4[yVar1 == YAML_UTF16LE_ENCODING] & 0xfc;
          if (bVar14 == 0xd8) {
            if (uVar18 < 4) {
              bVar6 = true;
              if (parser->eof == 0) goto LAB_0019c814;
              uVar13 = parser->offset;
              parser->error = YAML_READER_ERROR;
              pcVar17 = "incomplete UTF-16 surrogate pair";
              goto LAB_0019cc87;
            }
            uVar16 = (uint)CONCAT11(pbVar4[(ulong)(yVar1 != YAML_UTF16LE_ENCODING) ^ 3],
                                    pbVar4[(ulong)(yVar1 != YAML_UTF16LE_ENCODING) + 2]);
            if ((pbVar4[(ulong)(yVar1 != YAML_UTF16LE_ENCODING) ^ 3] & 0xfc) != 0xdc) {
              parser->error = YAML_READER_ERROR;
              parser->problem = "expected low surrogate area";
              parser->problem_offset = parser->offset + 2;
              parser->problem_value = uVar16;
              goto LAB_0019cbca;
            }
            uVar12 = (ulong)((uVar8 & 0x3ff) * 0x400 + (uVar16 & 0x3ff) + 0x10000);
            uVar16 = 4;
          }
          else {
            uVar16 = 2;
            if (bVar14 == 0xdc) {
              sVar15 = parser->offset;
              parser->error = YAML_READER_ERROR;
              pcVar17 = "unexpected low surrogate area";
              goto LAB_0019ccac;
            }
          }
LAB_0019ca1e:
          if ((0xd < (uint)uVar12) || ((0x2600U >> ((uint)uVar12 & 0x1f) & 1) == 0)) {
LAB_0019ca28:
            uVar8 = (uint)uVar12;
            if (((uVar8 < 0x10000) &&
                (((0xd75f < uVar8 - 0xa0 && (uVar8 != 0x85)) && (0x5e < uVar8 - 0x20)))) &&
               (0x1ffd < uVar8 - 0xe000)) {
              sVar15 = parser->offset;
              parser->error = YAML_READER_ERROR;
              pcVar17 = "control characters are not allowed";
              goto LAB_0019ccac;
            }
          }
          (parser->raw_buffer).pointer = pbVar4 + uVar16;
          parser->offset = parser->offset + (ulong)uVar16;
          uVar16 = (uint)uVar12;
          if (0x7f < uVar16) {
            if (uVar16 < 0x800) {
              bVar14 = (byte)(uVar12 >> 6) | 0xc0;
            }
            else {
              pbVar4 = (parser->buffer).last;
              (parser->buffer).last = pbVar4 + 1;
              if (uVar16 < 0x10000) {
                *pbVar4 = (byte)(uVar16 >> 0xc) | 0xe0;
              }
              else {
                *pbVar4 = (char)(uVar16 >> 0x12) - 0x10;
                pbVar4 = (parser->buffer).last;
                (parser->buffer).last = pbVar4 + 1;
                *pbVar4 = (byte)(uVar12 >> 0xc) & 0x3f | 0x80;
              }
              bVar14 = (byte)(uVar12 >> 6) & 0x3f | 0x80;
            }
            pbVar4 = (parser->buffer).last;
            (parser->buffer).last = pbVar4 + 1;
            *pbVar4 = bVar14;
            uVar12 = (ulong)((byte)uVar12 & 0x3f | 0x80);
          }
          pyVar2 = (parser->buffer).last;
          (parser->buffer).last = pyVar2 + 1;
          *pyVar2 = (yaml_char_t)uVar12;
          parser->unread = parser->unread + 1;
        }
        bVar6 = true;
      } while (parser->eof == 0);
      pyVar2 = (parser->buffer).last;
      (parser->buffer).last = pyVar2 + 1;
      *pyVar2 = '\0';
      parser->unread = parser->unread + 1;
LAB_0019ccfa:
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_update_buffer(yaml_parser_t *parser, size_t length)
{
    int first = 1;

    assert(parser->read_handler);   /* Read handler must be set. */

    /* If the EOF flag is set and the raw buffer is empty, do nothing. */

    if (parser->eof && parser->raw_buffer.pointer == parser->raw_buffer.last)
        return 1;

    /* Return if the buffer contains enough characters. */

    if (parser->unread >= length)
        return 1;

    /* Determine the input encoding if it is not known yet. */

    if (!parser->encoding) {
        if (!yaml_parser_determine_encoding(parser))
            return 0;
    }

    /* Move the unread characters to the beginning of the buffer. */

    if (parser->buffer.start < parser->buffer.pointer
            && parser->buffer.pointer < parser->buffer.last) {
        size_t size = parser->buffer.last - parser->buffer.pointer;
        memmove(parser->buffer.start, parser->buffer.pointer, size);
        parser->buffer.pointer = parser->buffer.start;
        parser->buffer.last = parser->buffer.start + size;
    }
    else if (parser->buffer.pointer == parser->buffer.last) {
        parser->buffer.pointer = parser->buffer.start;
        parser->buffer.last = parser->buffer.start;
    }

    /* Fill the buffer until it has enough characters. */

    while (parser->unread < length)
    {
        /* Fill the raw buffer if necessary. */

        if (!first || parser->raw_buffer.pointer == parser->raw_buffer.last) {
            if (!yaml_parser_update_raw_buffer(parser)) return 0;
        }
        first = 0;

        /* Decode the raw buffer. */

        while (parser->raw_buffer.pointer != parser->raw_buffer.last)
        {
            unsigned int value = 0, value2 = 0;
            int incomplete = 0;
            unsigned char octet;
            unsigned int width = 0;
            int low, high;
            size_t k;
            size_t raw_unread = parser->raw_buffer.last - parser->raw_buffer.pointer;

            /* Decode the next character. */

            switch (parser->encoding)
            {
                case YAML_UTF8_ENCODING:

                    /*
                     * Decode a UTF-8 character.  Check RFC 3629
                     * (http://www.ietf.org/rfc/rfc3629.txt) for more details.
                     *
                     * The following table (taken from the RFC) is used for
                     * decoding.
                     *
                     *    Char. number range |        UTF-8 octet sequence
                     *      (hexadecimal)    |              (binary)
                     *   --------------------+------------------------------------
                     *   0000 0000-0000 007F | 0xxxxxxx
                     *   0000 0080-0000 07FF | 110xxxxx 10xxxxxx
                     *   0000 0800-0000 FFFF | 1110xxxx 10xxxxxx 10xxxxxx
                     *   0001 0000-0010 FFFF | 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
                     *
                     * Additionally, the characters in the range 0xD800-0xDFFF
                     * are prohibited as they are reserved for use with UTF-16
                     * surrogate pairs.
                     */

                    /* Determine the length of the UTF-8 sequence. */

                    octet = parser->raw_buffer.pointer[0];
                    width = (octet & 0x80) == 0x00 ? 1 :
                            (octet & 0xE0) == 0xC0 ? 2 :
                            (octet & 0xF0) == 0xE0 ? 3 :
                            (octet & 0xF8) == 0xF0 ? 4 : 0;

                    /* Check if the leading octet is valid. */

                    if (!width)
                        return yaml_parser_set_reader_error(parser,
                                "invalid leading UTF-8 octet",
                                parser->offset, octet);

                    /* Check if the raw buffer contains an incomplete character. */

                    if (width > raw_unread) {
                        if (parser->eof) {
                            return yaml_parser_set_reader_error(parser,
                                    "incomplete UTF-8 octet sequence",
                                    parser->offset, -1);
                        }
                        incomplete = 1;
                        break;
                    }

                    /* Decode the leading octet. */

                    value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                            (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                            (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                            (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;

                    /* Check and decode the trailing octets. */

                    for (k = 1; k < width; k ++)
                    {
                        octet = parser->raw_buffer.pointer[k];

                        /* Check if the octet is valid. */

                        if ((octet & 0xC0) != 0x80)
                            return yaml_parser_set_reader_error(parser,
                                    "invalid trailing UTF-8 octet",
                                    parser->offset+k, octet);

                        /* Decode the octet. */

                        value = (value << 6) + (octet & 0x3F);
                    }

                    /* Check the length of the sequence against the value. */

                    if (!((width == 1) ||
                            (width == 2 && value >= 0x80) ||
                            (width == 3 && value >= 0x800) ||
                            (width == 4 && value >= 0x10000)))
                        return yaml_parser_set_reader_error(parser,
                                "invalid length of a UTF-8 sequence",
                                parser->offset, -1);

                    /* Check the range of the value. */

                    if ((value >= 0xD800 && value <= 0xDFFF) || value > 0x10FFFF)
                        return yaml_parser_set_reader_error(parser,
                                "invalid Unicode character",
                                parser->offset, value);

                    break;

                case YAML_UTF16LE_ENCODING:
                case YAML_UTF16BE_ENCODING:

                    low = (parser->encoding == YAML_UTF16LE_ENCODING ? 0 : 1);
                    high = (parser->encoding == YAML_UTF16LE_ENCODING ? 1 : 0);

                    /*
                     * The UTF-16 encoding is not as simple as one might
                     * naively think.  Check RFC 2781
                     * (http://www.ietf.org/rfc/rfc2781.txt).
                     *
                     * Normally, two subsequent bytes describe a Unicode
                     * character.  However a special technique (called a
                     * surrogate pair) is used for specifying character
                     * values larger than 0xFFFF.
                     *
                     * A surrogate pair consists of two pseudo-characters:
                     *      high surrogate area (0xD800-0xDBFF)
                     *      low surrogate area (0xDC00-0xDFFF)
                     *
                     * The following formulas are used for decoding
                     * and encoding characters using surrogate pairs:
                     *
                     *  U  = U' + 0x10000   (0x01 00 00 <= U <= 0x10 FF FF)
                     *  U' = yyyyyyyyyyxxxxxxxxxx   (0 <= U' <= 0x0F FF FF)
                     *  W1 = 110110yyyyyyyyyy
                     *  W2 = 110111xxxxxxxxxx
                     *
                     * where U is the character value, W1 is the high surrogate
                     * area, W2 is the low surrogate area.
                     */

                    /* Check for incomplete UTF-16 character. */

                    if (raw_unread < 2) {
                        if (parser->eof) {
                            return yaml_parser_set_reader_error(parser,
                                    "incomplete UTF-16 character",
                                    parser->offset, -1);
                        }
                        incomplete = 1;
                        break;
                    }

                    /* Get the character. */

                    value = parser->raw_buffer.pointer[low]
                        + (parser->raw_buffer.pointer[high] << 8);

                    /* Check for unexpected low surrogate area. */

                    if ((value & 0xFC00) == 0xDC00)
                        return yaml_parser_set_reader_error(parser,
                                "unexpected low surrogate area",
                                parser->offset, value);

                    /* Check for a high surrogate area. */

                    if ((value & 0xFC00) == 0xD800) {

                        width = 4;

                        /* Check for incomplete surrogate pair. */

                        if (raw_unread < 4) {
                            if (parser->eof) {
                                return yaml_parser_set_reader_error(parser,
                                        "incomplete UTF-16 surrogate pair",
                                        parser->offset, -1);
                            }
                            incomplete = 1;
                            break;
                        }

                        /* Get the next character. */

                        value2 = parser->raw_buffer.pointer[low+2]
                            + (parser->raw_buffer.pointer[high+2] << 8);

                        /* Check for a low surrogate area. */

                        if ((value2 & 0xFC00) != 0xDC00)
                            return yaml_parser_set_reader_error(parser,
                                    "expected low surrogate area",
                                    parser->offset+2, value2);

                        /* Generate the value of the surrogate pair. */

                        value = 0x10000 + ((value & 0x3FF) << 10) + (value2 & 0x3FF);
                    }

                    else {
                        width = 2;
                    }

                    break;

                default:
                    assert(1);      /* Impossible. */
            }

            /* Check if the raw buffer contains enough bytes to form a character. */

            if (incomplete) break;

            /*
             * Check if the character is in the allowed range:
             *      #x9 | #xA | #xD | [#x20-#x7E]               (8 bit)
             *      | #x85 | [#xA0-#xD7FF] | [#xE000-#xFFFD]    (16 bit)
             *      | [#x10000-#x10FFFF]                        (32 bit)
             */

            if (! (value == 0x09 || value == 0x0A || value == 0x0D
                        || (value >= 0x20 && value <= 0x7E)
                        || (value == 0x85) || (value >= 0xA0 && value <= 0xD7FF)
                        || (value >= 0xE000 && value <= 0xFFFD)
                        || (value >= 0x10000 && value <= 0x10FFFF)))
                return yaml_parser_set_reader_error(parser,
                        "control characters are not allowed",
                        parser->offset, value);

            /* Move the raw pointers. */

            parser->raw_buffer.pointer += width;
            parser->offset += width;

            /* Finally put the character into the buffer. */

            /* 0000 0000-0000 007F -> 0xxxxxxx */
            if (value <= 0x7F) {
                *(parser->buffer.last++) = value;
            }
            /* 0000 0080-0000 07FF -> 110xxxxx 10xxxxxx */
            else if (value <= 0x7FF) {
                *(parser->buffer.last++) = 0xC0 + (value >> 6);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }
            /* 0000 0800-0000 FFFF -> 1110xxxx 10xxxxxx 10xxxxxx */
            else if (value <= 0xFFFF) {
                *(parser->buffer.last++) = 0xE0 + (value >> 12);
                *(parser->buffer.last++) = 0x80 + ((value >> 6) & 0x3F);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }
            /* 0001 0000-0010 FFFF -> 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
            else {
                *(parser->buffer.last++) = 0xF0 + (value >> 18);
                *(parser->buffer.last++) = 0x80 + ((value >> 12) & 0x3F);
                *(parser->buffer.last++) = 0x80 + ((value >> 6) & 0x3F);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }

            parser->unread ++;
        }

        /* On EOF, put NUL into the buffer and return. */

        if (parser->eof) {
            *(parser->buffer.last++) = '\0';
            parser->unread ++;
            return 1;
        }

    }

    if (parser->offset >= MAX_FILE_SIZE) {
        return yaml_parser_set_reader_error(parser, "input is too long",
            parser->offset, -1);
    }

    return 1;
}